

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_predicate_push_response_headers_send(nghttp2_session *session,nghttp2_stream *stream)

{
  long in_RSI;
  long in_RDI;
  int rv;
  nghttp2_session *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = session_predicate_for_stream_send(in_stack_ffffffffffffffd8,(nghttp2_stream *)0x11cded);
  if (local_4 == 0) {
    if (in_RSI == 0) {
      __assert_fail("stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                    ,0x77c,
                    "int session_predicate_push_response_headers_send(nghttp2_session *, nghttp2_stream *)"
                   );
    }
    if (*(char *)(in_RDI + 0xb74) == '\0') {
      local_4 = -0x1f9;
    }
    else if (*(int *)(in_RSI + 0xcc) == 4) {
      if ((*(byte *)(in_RDI + 0xb75) & 8) == 0) {
        local_4 = 0;
      }
      else {
        local_4 = -0x204;
      }
    }
    else {
      local_4 = -0x1f9;
    }
  }
  return local_4;
}

Assistant:

static int
session_predicate_push_response_headers_send(nghttp2_session *session,
                                             nghttp2_stream *stream) {
  int rv;
  /* TODO Should disallow HEADERS if GOAWAY has already been issued? */
  rv = session_predicate_for_stream_send(session, stream);
  if (rv != 0) {
    return rv;
  }
  assert(stream);
  if (!session->server) {
    return NGHTTP2_ERR_PROTO;
  }
  if (stream->state != NGHTTP2_STREAM_RESERVED) {
    return NGHTTP2_ERR_PROTO;
  }
  if (session->goaway_flags & NGHTTP2_GOAWAY_RECV) {
    return NGHTTP2_ERR_START_STREAM_NOT_ALLOWED;
  }
  return 0;
}